

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::ImageView::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  long *plVar1;
  undefined8 uVar2;
  deUint64 dVar3;
  Parameters *env_00;
  VkResult result;
  Handle<(vk::HandleType)9> *pHVar4;
  Handle<(vk::HandleType)7> *pHVar5;
  Parameters PVar6;
  Parameters local_30;
  Parameters *local_20;
  Parameters *params_local;
  Environment *env_local;
  Resources *this_local;
  
  local_20 = params;
  params_local = (Parameters *)env;
  env_local = (Environment *)this;
  Dependency<vkt::api::(anonymous_namespace)::Image>::Dependency(&this->image,env,&params->image);
  env_00 = params_local;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  PVar6 = getDeviceMemoryParameters((Environment *)env_00,(VkImage)pHVar4->m_internal);
  local_30.size = PVar6.size;
  local_30.memoryTypeIndex = PVar6.memoryTypeIndex;
  Dependency<vkt::api::(anonymous_namespace)::DeviceMemory>::Dependency
            (&this->memory,(Environment *)env_00,&local_30);
  plVar1 = *(long **)&(params_local->image).format;
  uVar2._0_4_ = (params_local->image).extent.height;
  uVar2._4_4_ = (params_local->image).extent.depth;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar3 = pHVar4->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                     (&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  result = (**(code **)(*plVar1 + 0x68))(plVar1,uVar2,dVar3,pHVar5->m_internal,0);
  ::vk::checkResult(result,"env.vkd.bindImageMemory(env.device, *image.object, *memory.object, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
                    ,0x356);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: image	(env, params.image)
			, memory(env, getDeviceMemoryParameters(env, *image.object))
		{
			VK_CHECK(env.vkd.bindImageMemory(env.device, *image.object, *memory.object, 0));
		}